

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O3

void __thiscall
MinVR::VRSpecificItemFactory<MinVR::VRInputDevice>::~VRSpecificItemFactory
          (VRSpecificItemFactory<MinVR::VRInputDevice> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_VRItemFactory)._vptr_VRItemFactory =
       (_func_int **)&PTR__VRSpecificItemFactory_00176768;
  pcVar1 = (this->_typeName)._M_dataplus._M_p;
  paVar2 = &(this->_typeName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~VRSpecificItemFactory() {}